

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_chunk.c
# Opt level: O2

void soa_chunk_free(soa_chunk_t *chunk,void *p,size_t blockSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint __line;
  ulong uVar3;
  char *__assertion;
  ulong uVar4;
  
  if (p < chunk->blockData) {
    __assertion = "pChar >= chunk->blockData";
    __line = 0x35;
  }
  else {
    uVar4 = (long)p - (long)chunk->blockData;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = blockSize;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar3 = SUB168(auVar2 / auVar1,0);
    if (uVar4 % blockSize == 0) {
      *(uchar *)p = chunk->firstBlock;
      if (blockSize * uVar3 - uVar4 == 0) {
        if (uVar3 < 0x100) {
          chunk->firstBlock = SUB161(auVar2 / auVar1,0);
          chunk->freeBlocks = chunk->freeBlocks + '\x01';
          return;
        }
        __assertion = "newFirstAvailableBlock < 256";
        __line = 0x3b;
      }
      else {
        __assertion = "newFirstAvailableBlock*blockSize == pOffset";
        __line = 0x3a;
      }
    }
    else {
      __assertion = "pOffset % blockSize == 0";
      __line = 0x37;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_chunk.c"
                ,__line,"void soa_chunk_free(soa_chunk_t *, void *, size_t)");
}

Assistant:

void soa_chunk_free( soa_chunk_t *chunk,void *p, size_t blockSize )
{
  size_t pOffset;
  size_t newFirstAvailableBlock;
  unsigned char *pChar = ((unsigned char*)p);
  assert( pChar >= chunk->blockData); //assert that p belongs to this chunk
  pOffset = pChar - chunk->blockData;
  assert(pOffset % blockSize == 0); //assert that p is aligned to the first byte of a block
  *pChar = chunk->firstBlock;       //store index of first available block in byte 0 of the freed block
  newFirstAvailableBlock = pOffset / blockSize;
  assert(newFirstAvailableBlock*blockSize == pOffset); //check for truncation error
  assert(newFirstAvailableBlock < 256); //check for index out of bounds error  
  chunk->firstBlock = (unsigned char) newFirstAvailableBlock;
  chunk->freeBlocks++;
}